

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O3

int __thiscall PFData::emplaceSubgridFromFile(PFData *this,FILE *fp,int gridZ,int gridY,int gridX)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  double dVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int size_2;
  int iVar17;
  int start_1;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  size_t __n;
  long lVar22;
  long lVar23;
  
  lVar6 = getSubgridOffsetElements(this,gridZ,gridY,gridX);
  iVar20 = 0;
  fseek((FILE *)fp,
        (long)(((this->m_q * gridZ + gridY) * this->m_p + gridX) * 0x24) + lVar6 * 8 + 100,0);
  iVar12 = this->m_r;
  iVar5 = this->m_ny;
  iVar3 = this->m_nz / iVar12;
  iVar14 = (uint)(gridZ < this->m_nz % iVar12) + iVar3;
  iVar18 = this->m_p;
  iVar16 = iVar5 / iVar18;
  iVar11 = iVar5 % this->m_q;
  iVar19 = gridY;
  if (iVar11 < gridY) {
    iVar19 = iVar11;
  }
  iVar10 = -(iVar11 - gridY) * iVar16;
  if (gridY < iVar11) {
    iVar10 = iVar20;
  }
  iVar1 = this->m_nx;
  iVar17 = iVar1 / iVar18;
  iVar18 = iVar1 % iVar18;
  iVar12 = iVar1 % iVar12;
  iVar21 = gridZ;
  if (iVar12 < gridZ) {
    iVar21 = iVar12;
  }
  iVar4 = -(iVar12 - gridZ) * iVar3;
  if (gridZ < iVar12) {
    iVar4 = iVar20;
  }
  iVar12 = gridX;
  if (iVar18 < gridX) {
    iVar12 = iVar18;
  }
  iVar13 = -(iVar18 - gridX) * iVar17;
  if (gridX < iVar18) {
    iVar13 = iVar20;
  }
  if (0 < iVar14) {
    iVar11 = (uint)(gridY < iVar11) + iVar16;
    iVar19 = iVar19 * (iVar16 + 1);
    iVar13 = iVar13 + iVar12 * (iVar17 + 1);
    iVar5 = (iVar4 + iVar21 * (iVar3 + 1)) * iVar5;
    iVar17 = (uint)(gridX < iVar18) + iVar17;
    __n = (size_t)iVar17;
    lVar6 = (long)((iVar5 + iVar10 + iVar19) * iVar1 + iVar13);
    iVar12 = 0;
    do {
      if (0 < iVar11) {
        iVar18 = 0;
        do {
          lVar23 = (long)(this->m_nx * iVar12 * this->m_ny);
          lVar15 = (long)(this->m_nx * iVar18);
          pdVar2 = this->m_data;
          sVar7 = fread(pdVar2 + (long)((iVar10 + iVar19 + iVar5) * iVar1 + iVar13) +
                                 lVar23 + lVar15,8,__n,(FILE *)fp);
          if (sVar7 != __n) {
            piVar9 = __errno_location();
            return *piVar9;
          }
          if (iVar17 != 0) {
            lVar22 = 0;
            do {
              dVar8 = (double)bswap64((uint64_t)pdVar2[lVar6 + lVar15 + lVar23 + lVar22]);
              pdVar2[lVar6 + lVar15 + lVar23 + lVar22] = dVar8;
              lVar22 = lVar22 + 1;
            } while (__n + (__n == 0) != lVar22);
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar11);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar14);
  }
  return 0;
}

Assistant:

int PFData::emplaceSubgridFromFile(std::FILE* fp, int gridZ, int gridY, int gridX){
    //Position file
    const long offset = getSubgridOffset(gridZ, gridY, gridX) + 36;
    std::fseek(fp, offset, SEEK_SET);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const int startZ = getSubgridStartZ(gridZ);
    const int startY = getSubgridStartY(gridY);
    const int startX = getSubgridStartX(gridX);

    //The index into m_data where the first element of the grid belongs.
    const long long startOfGrid = startZ*m_nx*m_ny + startY * m_nx + startX;

    for(int z = 0; z < sizeZ; ++z){
        for(int y = 0; y < sizeY; ++y){
            const long long index = startOfGrid + z * m_nx * m_ny + y * m_nx;
            double* const dataPtr = &(m_data[index]);

            const std::size_t numRead = std::fread(dataPtr, 8, sizeX, fp);
            if(numRead != static_cast<std::size_t>(sizeX)){
                return errno;
            }

            //Perform endian byte swap
            for(std::size_t i = 0; i < sizeX; ++i){
                uint64_t tmp = *reinterpret_cast<uint64_t*>(&dataPtr[i]);
                tmp = bswap64(tmp);
                dataPtr[i] = *reinterpret_cast<double*>(&tmp);
            }
        }
    }

    return 0;
}